

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O2

void __thiscall
fasttext::Autotune::train(Autotune *this,Args *autotuneArgs,AutotuneCallback *callback)

{
  int iVar1;
  int iVar2;
  double dVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  AutotuneStrategy *this_00;
  ostream *poVar7;
  Args *this_01;
  Autotune *pAVar8;
  invalid_argument *this_02;
  runtime_error *this_03;
  pointer __p;
  double local_750;
  metric_name local_734;
  ElapsedTimeMarker elapsedTimeMarker;
  string local_728;
  Meter meter;
  Args bestTrainArgs;
  Args trainArgs;
  ifstream validationFileStream;
  Autotune local_1c0 [4];
  
  std::ifstream::ifstream
            (&validationFileStream,(string *)&autotuneArgs->autotuneValidationFile,_S_in);
  pAVar8 = local_1c0;
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_02,"Validation file cannot be opened!");
    __cxa_throw(this_02,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  printSkippedArgs(pAVar8,autotuneArgs);
  std::function<void_(double,_int,_double,_double)>::operator=(&this->callback_,callback);
  this->verbose_ = autotuneArgs->autotuneVerbose;
  iVar1 = autotuneArgs->verbose;
  Args::Args(&bestTrainArgs,autotuneArgs);
  Args::Args(&trainArgs,autotuneArgs);
  trainArgs.verbose = 0;
  this_00 = (AutotuneStrategy *)operator_new(0x1d8);
  AutotuneStrategy::AutotuneStrategy(this_00,&trainArgs,(long)autotuneArgs->seed);
  meter.metrics_.gold = 0;
  std::__uniq_ptr_impl<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
  ::reset((__uniq_ptr_impl<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
           *)&this->strategy_,this_00);
  std::unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>::
  ~unique_ptr((unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
               *)&meter);
  startTimer(this,autotuneArgs);
  bVar4 = false;
  while ((((this->continueTraining_)._M_base._M_i & 1U) != 0 &&
         (this->elapsed_ < (double)autotuneArgs->autotuneDuration))) {
    this->trials_ = this->trials_ + 1;
    AutotuneStrategy::ask
              ((Args *)&meter,
               (this->strategy_)._M_t.
               super___uniq_ptr_impl<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
               ._M_t.
               super__Tuple_impl<0UL,_fasttext::AutotuneStrategy_*,_std::default_delete<fasttext::AutotuneStrategy>_>
               .super__Head_base<0UL,_fasttext::AutotuneStrategy_*,_false>._M_head_impl,
               this->elapsed_);
    Args::operator=(&trainArgs,(Args *)&meter);
    this_01 = (Args *)&meter;
    Args::~Args((Args *)&meter);
    if (2 < autotuneArgs->verbose) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Trial = ");
      this_01 = (Args *)std::ostream::operator<<(poVar7,this->trials_);
      std::endl<char,std::char_traits<char>>((ostream *)this_01);
    }
    printArgs((Autotune *)this_01,&trainArgs,autotuneArgs);
    elapsedTimeMarker.start_.__d.__r = (time_point)(duration)0x0;
    elapsedTimeMarker.start_.__d.__r = (time_point)std::chrono::_V2::steady_clock::now();
    meter.metrics_.predictedGold = 0;
    meter.metrics_.scoreVsTrue.
    super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    meter.metrics_.gold = 0;
    meter.metrics_.predicted = 0;
    FastText::train(this->fastText_,&trainArgs,(TrainCallback *)&meter);
    std::_Function_base::~_Function_base((_Function_base *)&meter);
    bVar6 = quantize(this,&trainArgs,autotuneArgs);
    if (bVar6) {
      Args::getAutotuneMetricLabel_abi_cxx11_(&local_728,autotuneArgs);
      meter.falseNegativeLabels_ = local_728._M_string_length != 0;
      meter.nexamples_ = 0;
      meter.metrics_.gold = 0;
      meter.metrics_.predicted = 0;
      meter.metrics_.predictedGold = 0;
      meter.metrics_.scoreVsTrue.
      super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      meter.metrics_.scoreVsTrue.
      super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      meter.metrics_.scoreVsTrue.
      super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      meter.labelMetrics_._M_h._M_buckets = &meter.labelMetrics_._M_h._M_single_bucket;
      meter.labelMetrics_._M_h._M_bucket_count = 1;
      meter.labelMetrics_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      meter.labelMetrics_._M_h._M_element_count = 0;
      meter.labelMetrics_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      meter.labelMetrics_._M_h._M_rehash_policy._4_4_ = 0;
      meter.labelMetrics_._M_h._M_rehash_policy._M_next_resize = 0;
      meter.labelMetrics_._M_h._M_single_bucket = (__node_base_ptr)0x0;
      FastText::test(this->fastText_,(istream *)&validationFileStream,
                     autotuneArgs->autotunePredictions,0.0,&meter);
      local_734 = Args::getAutotuneMetric(autotuneArgs);
      dVar3 = Args::getAutotuneMetricValue(autotuneArgs);
      local_750 = getMetricScore(this,&meter,&local_734,dVar3,&local_728);
      dVar3 = this->bestScore_;
      if (((dVar3 == -1.0) && (!NAN(dVar3))) || (dVar3 < local_750)) {
        Args::operator=(&bestTrainArgs,&trainArgs);
        this->bestScore_ = local_750;
        AutotuneStrategy::updateBest
                  ((this->strategy_)._M_t.
                   super___uniq_ptr_impl<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_fasttext::AutotuneStrategy_*,_std::default_delete<fasttext::AutotuneStrategy>_>
                   .super__Head_base<0UL,_fasttext::AutotuneStrategy_*,_false>._M_head_impl,
                   &bestTrainArgs);
      }
      Meter::~Meter(&meter);
      std::__cxx11::string::~string((string *)&local_728);
    }
    else {
      iVar2 = this->sizeConstraintFailed_;
      this->sizeConstraintFailed_ = iVar2 + 1;
      if (bVar4) {
        local_750 = NAN;
      }
      else {
        local_750 = NAN;
        if ((int)((uint)this->trials_ >> 1) <= iVar2 && 10 < this->trials_) {
          poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          poVar7 = std::operator<<(poVar7,
                                   "Warning : requested model size is probably too small. You may want to increase `autotune-modelsize`."
                                  );
          bVar4 = true;
          std::endl<char,std::char_traits<char>>(poVar7);
          local_750 = NAN;
        }
      }
    }
    if (2 < autotuneArgs->verbose) {
      if (NAN(local_750)) {
        poVar7 = std::operator<<((ostream *)&std::cout,"currentScore = NaN");
      }
      else {
        std::operator<<((ostream *)&std::cout,"currentScore = ");
        poVar7 = std::ostream::_M_insert<double>(local_750);
      }
      std::endl<char,std::char_traits<char>>(poVar7);
      if (2 < autotuneArgs->verbose) {
        std::operator<<((ostream *)&std::cout,"train took = ");
        meter.metrics_.gold = std::chrono::_V2::steady_clock::now();
        dVar3 = utils::getDuration(&elapsedTimeMarker.start_,(time_point *)&meter);
        poVar7 = std::ostream::_M_insert<double>(dVar3);
        std::endl<char,std::char_traits<char>>(poVar7);
      }
    }
  }
  if ((this->timer_)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->bestScore_ == -1.0) && (!NAN(this->bestScore_))) {
    meter.metrics_.gold = (uint64_t)&meter.metrics_.predictedGold;
    meter.metrics_.predicted = 0;
    meter.metrics_.predictedGold = meter.metrics_.predictedGold & 0xffffffffffffff00;
    std::__cxx11::string::assign((char *)&meter);
    this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_03,(string *)&meter);
    __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  pAVar8 = (Autotune *)std::operator<<((ostream *)&std::cerr,"Training again with best arguments");
  std::endl<char,std::char_traits<char>>((ostream *)pAVar8);
  bestTrainArgs.verbose = iVar1;
  if (2 < autotuneArgs->verbose) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Best selected args = ");
    pAVar8 = (Autotune *)std::ostream::operator<<(poVar7,0);
    std::endl<char,std::char_traits<char>>((ostream *)pAVar8);
  }
  printArgs(pAVar8,&bestTrainArgs,autotuneArgs);
  meter.metrics_.predictedGold = 0;
  meter.metrics_.scoreVsTrue.
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  meter.metrics_.gold = 0;
  meter.metrics_.predicted = 0;
  FastText::train(this->fastText_,&bestTrainArgs,(TrainCallback *)&meter);
  std::_Function_base::~_Function_base((_Function_base *)&meter);
  quantize(this,&bestTrainArgs,autotuneArgs);
  Args::~Args(&trainArgs);
  Args::~Args(&bestTrainArgs);
  std::ifstream::~ifstream(&validationFileStream);
  return;
}

Assistant:

void Autotune::train(const Args& autotuneArgs, const AutotuneCallback& callback) {
  std::ifstream validationFileStream(autotuneArgs.autotuneValidationFile);
  if (!validationFileStream.is_open()) {
    throw std::invalid_argument("Validation file cannot be opened!");
  }
  printSkippedArgs(autotuneArgs);

  this->callback_ = callback;
  this->verbose_ = autotuneArgs.autotuneVerbose;

  bool sizeConstraintWarning = false;
  int verbose = autotuneArgs.verbose;
  Args bestTrainArgs(autotuneArgs);
  Args trainArgs(autotuneArgs);
  trainArgs.verbose = 0;
  strategy_ = std::unique_ptr<AutotuneStrategy>(
      new AutotuneStrategy(trainArgs, autotuneArgs.seed));
  startTimer(autotuneArgs);

  while (keepTraining(autotuneArgs.autotuneDuration)) {
    trials_++;

    trainArgs = strategy_->ask(elapsed_);
    LOG_VAL(Trial, trials_)
    printArgs(trainArgs, autotuneArgs);
    ElapsedTimeMarker elapsedTimeMarker;
    double currentScore = std::numeric_limits<double>::quiet_NaN();
    try {
      fastText_->train(trainArgs);
      bool sizeConstraintOK = quantize(trainArgs, autotuneArgs);
      if (sizeConstraintOK) {
        const auto& metricLabel = autotuneArgs.getAutotuneMetricLabel();
        Meter meter(!metricLabel.empty());
        fastText_->test(
            validationFileStream, autotuneArgs.autotunePredictions, 0.0, meter);

        currentScore = getMetricScore(
            meter,
            autotuneArgs.getAutotuneMetric(),
            autotuneArgs.getAutotuneMetricValue(),
            metricLabel);

        if (bestScore_ == kUnknownBestScore || (currentScore > bestScore_)) {
          bestTrainArgs = trainArgs;
          bestScore_ = currentScore;
          strategy_->updateBest(bestTrainArgs);
        }
      } else {
        sizeConstraintFailed_++;
        if (!sizeConstraintWarning && trials_ > 10 &&
            sizeConstraintFailed_ > (trials_ / 2)) {
          sizeConstraintWarning = true;
          std::cerr << std::endl
                    << "Warning : requested model size is probably too small. "
                       "You may want to increase `autotune-modelsize`."
                    << std::endl;
        }
      }
    } catch (DenseMatrix::EncounteredNaNError&) {
      // ignore diverging loss and go on
    } catch (std::bad_alloc&) {
      // ignore parameter samples asking too much memory
    } catch (TimeoutError&) {
      break;
    } catch (FastText::AbortError&) {
      break;
    }
    LOG_VAL_NAN(currentScore, currentScore)
    LOG_VAL(train took, elapsedTimeMarker.getElapsed())
  }
  if (timer_.joinable()) {
    timer_.join();
  }

  if (bestScore_ == kUnknownBestScore) {
    std::string errorMessage;
    if (sizeConstraintWarning) {
      errorMessage =
          "Couldn't fulfil model size constraint: please increase "
          "`autotune-modelsize`.";
    } else {
      errorMessage =
          "Didn't have enough time to train once: please increase "
          "`autotune-duration`.";
    }
    throw std::runtime_error(errorMessage);
  } else {
    std::cerr << std::endl;
    std::cerr << "Training again with best arguments" << std::endl;
    bestTrainArgs.verbose = verbose;
    LOG_VAL(Best selected args, 0)
    printArgs(bestTrainArgs, autotuneArgs);
    fastText_->train(bestTrainArgs);
    quantize(bestTrainArgs, autotuneArgs);
  }
}